

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::promptRemoveNext(Private *this)

{
  ulong uVar1;
  usize uVar2;
  usize uVar3;
  uint *puVar4;
  String local_60;
  uint local_38 [4];
  undefined1 local_28 [8];
  Array<unsigned_int> newInput;
  Private *this_local;
  
  uVar1 = this->caretPos;
  newInput._capacity = (usize)this;
  uVar2 = Array<unsigned_int>::size(&this->input);
  if (uVar1 < uVar2) {
    uVar2 = this->caretPos;
    uVar3 = Array<unsigned_int>::size(&this->input);
    if (uVar2 == uVar3 - 1) {
      local_38[0] = 0;
      Array<unsigned_int>::resize(&this->input,this->caretPos,local_38);
    }
    else {
      uVar2 = Array<unsigned_int>::size(&this->input);
      Array<unsigned_int>::Array((Array<unsigned_int> *)local_28,uVar2 - 1);
      puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&this->input);
      Array<unsigned_int>::append((Array<unsigned_int> *)local_28,puVar4,this->caretPos);
      puVar4 = Array::operator_cast_to_unsigned_int_((Array *)&this->input);
      uVar2 = this->caretPos;
      uVar3 = Array<unsigned_int>::size(&this->input);
      Array<unsigned_int>::append
                ((Array<unsigned_int> *)local_28,puVar4 + uVar2 + 1,~this->caretPos + uVar3);
      Array<unsigned_int>::swap(&this->input,(Array<unsigned_int> *)local_28);
      Array<unsigned_int>::~Array((Array<unsigned_int> *)local_28);
    }
    uVar3 = Array<unsigned_int>::size(&this->prompt);
    uVar2 = this->caretPos;
    String::String<2ul>(&local_60,(char (*) [2])" ");
    promptWrite(this,uVar3 + uVar2,&local_60);
    String::~String(&local_60);
  }
  return;
}

Assistant:

void promptRemoveNext()
  {
    if(caretPos < input.size())
    {
      if(caretPos != input.size() - 1)
      {
        Array<conchar> newInput(input.size() - 1);
        newInput.append(input,  caretPos);
        newInput.append((conchar*)input + caretPos + 1, input.size() - (caretPos + 1));
        input.swap(newInput);
      }
      else
        input.resize(caretPos);
      promptWrite(prompt.size() + caretPos, " ");
    }
  }